

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UDPSocket.cpp
# Opt level: O2

bool __thiscall net_uv::UDPSocket::bind6(UDPSocket *this,char *ip,uint32_t port)

{
  int iVar1;
  uint uVar2;
  uv_udp_t *puVar3;
  int32_t errcode;
  string local_58;
  sockaddr_in6 bind_addr;
  
  if (this->m_udp == (uv_udp_t *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_58,ip,(allocator<char> *)&bind_addr);
    std::__cxx11::string::_M_assign((string *)&(this->super_Socket).m_ip);
    std::__cxx11::string::~string((string *)&local_58);
    (this->super_Socket).m_port = port;
    (this->super_Socket).m_isIPV6 = true;
    iVar1 = uv_ip6_addr(ip,port,&bind_addr);
    if (iVar1 == 0) {
      puVar3 = (uv_udp_t *)malloc(0xd8);
      this->m_udp = puVar3;
      uv_udp_init((this->super_Socket).m_loop,puVar3);
      puVar3 = this->m_udp;
      puVar3->data = this;
      iVar1 = uv_udp_bind(puVar3,(sockaddr *)&bind_addr,4);
      if (iVar1 == 0) {
        net_adjustBuffSize((uv_handle_t *)this->m_udp,0x10000,0x10000);
        uVar2 = uv_udp_recv_start(this->m_udp,Socket::uv_on_alloc_buffer,uv_on_after_read);
        if (uVar2 == 0) {
          return true;
        }
        net_getUVError_abi_cxx11_(&local_58,(net_uv *)(ulong)uVar2,errcode);
        net_uvLog(3,"uv_udp_recv_start error: %s",local_58._M_dataplus._M_p);
        std::__cxx11::string::~string((string *)&local_58);
      }
    }
  }
  return false;
}

Assistant:

bool UDPSocket::bind6(const char* ip, uint32_t port)
{
	if (m_udp != NULL)
	{
		return false;
	}

	this->setIp(ip);
	this->setPort(port);
	this->setIsIPV6(true);

	struct sockaddr_in6 bind_addr;
	int32_t r = uv_ip6_addr(ip, port, &bind_addr);

	if (r != 0)
	{
		return false;
	}

	m_udp = (uv_udp_t*)fc_malloc(sizeof(uv_udp_t));
	r = uv_udp_init(m_loop, m_udp);
	CHECK_UV_ASSERT(r);
	m_udp->data = this;

	r = uv_udp_bind(m_udp, (const struct sockaddr*) &bind_addr, UV_UDP_REUSEADDR);

	if (r != 0)
	{
		return false;
	}
	net_adjustBuffSize((uv_handle_t*)m_udp, UDP_UV_SOCKET_RECV_BUF_LEN, UDP_UV_SOCKET_RECV_BUF_LEN);

	r = uv_udp_recv_start(m_udp, uv_on_alloc_buffer, uv_on_after_read);
	if (r != 0)
	{
		NET_UV_LOG(NET_UV_L_ERROR, "uv_udp_recv_start error: %s", net_getUVError(r).c_str());
		return false;
	}

	return true;
}